

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::ColumnOrder::printTo(ColumnOrder *this,ostream *out)

{
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ColumnOrder(",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(out,"TYPE_ORDER=",0xb);
  if (((byte)this->__isset & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TypeDefinedOrder>(&local_38,&this->TYPE_ORDER);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void ColumnOrder::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnOrder(";
  out << "TYPE_ORDER="; (__isset.TYPE_ORDER ? (out << to_string(TYPE_ORDER)) : (out << "<null>"));
  out << ")";
}